

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type-builder.cpp
# Opt level: O0

void __thiscall
IsorecursiveTest_CanonicalizeGroups_Test::TestBody(IsorecursiveTest_CanonicalizeGroups_Test *this)

{
  bool bVar1;
  char *pcVar2;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *pvVar3;
  reference pvVar4;
  reference pvVar5;
  char *in_R9;
  Entry EVar6;
  AssertHelper local_4f0;
  Message local_4e8;
  undefined1 local_4e0 [8];
  AssertionResult gtest_ar_8;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> builtB2;
  AssertHelper local_498;
  Message local_490;
  undefined1 local_488 [8];
  AssertionResult gtest_ar__3;
  BuildResult resultB2;
  Struct local_448;
  TypeBuilder local_428;
  TypeBuilder builderB2;
  Message local_418;
  undefined1 local_410 [8];
  AssertionResult gtest_ar_7;
  Message local_3f8;
  undefined1 local_3f0 [8];
  AssertionResult gtest_ar_6;
  Message local_3d8;
  undefined1 local_3d0 [8];
  AssertionResult gtest_ar_5;
  Message local_3b8;
  undefined1 local_3b0 [8];
  AssertionResult gtest_ar_4;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> builtA2;
  AssertHelper local_368;
  Message local_360;
  undefined1 local_358 [8];
  AssertionResult gtest_ar__2;
  BuildResult resultA2;
  Struct local_318;
  Entry local_2f8;
  Struct local_2e8;
  Entry local_2c8;
  Struct local_2b8;
  Entry local_298;
  Struct local_288;
  TypeBuilder local_268;
  TypeBuilder builderA2;
  Message local_258;
  undefined1 local_250 [8];
  AssertionResult gtest_ar_3;
  Message local_238;
  undefined1 local_230 [8];
  AssertionResult gtest_ar_2;
  Message local_218;
  undefined1 local_210 [8];
  AssertionResult gtest_ar_1;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> builtB;
  AssertHelper local_1c8;
  Message local_1c0;
  undefined1 local_1b8 [8];
  AssertionResult gtest_ar__1;
  BuildResult resultB;
  Struct local_178;
  Entry local_158;
  Struct local_148;
  TypeBuilder local_130;
  TypeBuilder builderB;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar;
  vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> builtA;
  string local_e8;
  AssertHelper local_c8;
  Message local_c0;
  undefined1 local_b8 [8];
  AssertionResult gtest_ar_;
  BuildResult resultA;
  Struct local_78;
  Entry local_58;
  Struct local_48 [2];
  TypeBuilder local_18;
  TypeBuilder builderA;
  IsorecursiveTest_CanonicalizeGroups_Test *this_local;
  
  builderA.impl._M_t.
  super___uniq_ptr_impl<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>._M_t
  .super__Tuple_impl<0UL,_wasm::TypeBuilder::Impl_*,_std::default_delete<wasm::TypeBuilder::Impl>_>.
  super__Head_base<0UL,_wasm::TypeBuilder::Impl_*,_false>._M_head_impl =
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)
       (unique_ptr<wasm::TypeBuilder::Impl,_std::default_delete<wasm::TypeBuilder::Impl>_>)this;
  wasm::TypeBuilder::TypeBuilder(&local_18,2);
  wasm::TypeBuilder::createRecGroup((ulong)&local_18,0);
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48[0].fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(local_48);
  local_58 = wasm::TypeBuilder::operator[](&local_18,0);
  wasm::TypeBuilder::Entry::operator=(&local_58,local_48);
  wasm::Struct::~Struct(local_48);
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  wasm::Struct::Struct(&local_78);
  EVar6 = wasm::TypeBuilder::operator[](&local_18,1);
  resultA.
  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .
  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
  .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
  super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
       EVar6.builder;
  wasm::TypeBuilder::Entry::operator=
            ((Entry *)((long)&resultA.
                              super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                              .
                              super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                      + 0x18),&local_78);
  wasm::Struct::~Struct(&local_78);
  wasm::TypeBuilder::build();
  testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
            ((AssertionResult *)local_b8,(BuildResult *)&gtest_ar_.message_,(type *)0x0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_b8);
  if (!bVar1) {
    testing::Message::Message(&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_e8,(internal *)local_b8,(AssertionResult *)"resultA","false","true",in_R9);
    pcVar2 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
               ,0x14e,pcVar2);
    testing::internal::AssertHelper::operator=(&local_c8,&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    std::__cxx11::string::~string((string *)&local_e8);
    testing::Message::~Message(&local_c0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_b8);
  if (bVar1) {
    pvVar3 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar_.message_);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_,pvVar3)
    ;
    pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,0);
    pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                       ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                        &gtest_ar.message_,1);
    testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
              ((internal *)local_118,"builtA[0]","builtA[1]",pvVar4,pvVar5);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
    if (!bVar1) {
      testing::Message::Message(&local_120);
      pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&builderB,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x151,pcVar2);
      testing::internal::AssertHelper::operator=((AssertHelper *)&builderB,&local_120);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builderB);
      testing::Message::~Message(&local_120);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
    wasm::TypeBuilder::TypeBuilder(&local_130,2);
    local_148.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wasm::Struct::Struct(&local_148);
    local_158 = wasm::TypeBuilder::operator[](&local_130,0);
    wasm::TypeBuilder::Entry::operator=(&local_158,&local_148);
    wasm::Struct::~Struct(&local_148);
    local_178.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_178.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_178.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wasm::Struct::Struct(&local_178);
    EVar6 = wasm::TypeBuilder::operator[](&local_130,1);
    resultB.
    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .
    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
    .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
    super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
         EVar6.builder;
    wasm::TypeBuilder::Entry::operator=
              ((Entry *)((long)&resultB.
                                super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                .
                                super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                        + 0x18),&local_178);
    wasm::Struct::~Struct(&local_178);
    wasm::TypeBuilder::build();
    testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
              ((AssertionResult *)local_1b8,(BuildResult *)&gtest_ar__1.message_,(type *)0x0);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1b8);
    if (!bVar1) {
      testing::Message::Message(&local_1c0);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)
                 &builtB.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(internal *)local_1b8,
                 (AssertionResult *)"resultB","false","true",in_R9);
      pcVar2 = (char *)std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_1c8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                 ,0x158,pcVar2);
      testing::internal::AssertHelper::operator=(&local_1c8,&local_1c0);
      testing::internal::AssertHelper::~AssertHelper(&local_1c8);
      std::__cxx11::string::~string
                ((string *)
                 &builtB.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage);
      testing::Message::~Message(&local_1c0);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_1b8);
    if (bVar1) {
      pvVar3 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__1.message_);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_1.message_,
                 pvVar3);
      pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &gtest_ar_1.message_,0);
      pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &gtest_ar_1.message_,1);
      testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                ((EqHelper *)local_210,"builtB[0]","builtB[1]",pvVar4,pvVar5);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_210);
      if (!bVar1) {
        testing::Message::Message(&local_218);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_210);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x15b,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_218);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
        testing::Message::~Message(&local_218);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_210);
      pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &gtest_ar_1.message_,0);
      pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &gtest_ar.message_,0);
      testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
                ((internal *)local_230,"builtB[0]","builtA[0]",pvVar4,pvVar5);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_230);
      if (!bVar1) {
        testing::Message::Message(&local_238);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_230);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x15c,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_238);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_238);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_230);
      pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &gtest_ar_1.message_,0);
      pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                         ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                          &gtest_ar.message_,1);
      testing::internal::CmpHelperNE<wasm::HeapType,wasm::HeapType>
                ((internal *)local_250,"builtB[0]","builtA[1]",pvVar4,pvVar5);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_250);
      if (!bVar1) {
        testing::Message::Message(&local_258);
        pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_250);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&builderA2,kNonFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x15d,pcVar2);
        testing::internal::AssertHelper::operator=((AssertHelper *)&builderA2,&local_258);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builderA2);
        testing::Message::~Message(&local_258);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_250);
      wasm::TypeBuilder::TypeBuilder(&local_268,4);
      wasm::TypeBuilder::createRecGroup((ulong)&local_268,0);
      wasm::TypeBuilder::createRecGroup((ulong)&local_268,2);
      local_288.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_288.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_288.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      wasm::Struct::Struct(&local_288);
      local_298 = wasm::TypeBuilder::operator[](&local_268,0);
      wasm::TypeBuilder::Entry::operator=(&local_298,&local_288);
      wasm::Struct::~Struct(&local_288);
      local_2b8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2b8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2b8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      wasm::Struct::Struct(&local_2b8);
      local_2c8 = wasm::TypeBuilder::operator[](&local_268,1);
      wasm::TypeBuilder::Entry::operator=(&local_2c8,&local_2b8);
      wasm::Struct::~Struct(&local_2b8);
      local_2e8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_2e8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_2e8.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      wasm::Struct::Struct(&local_2e8);
      local_2f8 = wasm::TypeBuilder::operator[](&local_268,2);
      wasm::TypeBuilder::Entry::operator=(&local_2f8,&local_2e8);
      wasm::Struct::~Struct(&local_2e8);
      local_318.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_318.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_318.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      wasm::Struct::Struct(&local_318);
      EVar6 = wasm::TypeBuilder::operator[](&local_268,3);
      resultA2.
      super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .
      super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
      .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
      super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
           EVar6.builder;
      wasm::TypeBuilder::Entry::operator=
                ((Entry *)((long)&resultA2.
                                  super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                  .
                                  super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                          + 0x18),&local_318);
      wasm::Struct::~Struct(&local_318);
      wasm::TypeBuilder::build();
      testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
                ((AssertionResult *)local_358,(BuildResult *)&gtest_ar__2.message_,(type *)0x0);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_358);
      if (!bVar1) {
        testing::Message::Message(&local_360);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)
                   &builtA2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_358,
                   (AssertionResult *)"resultA2","false","true",in_R9);
        pcVar2 = (char *)std::__cxx11::string::c_str();
        testing::internal::AssertHelper::AssertHelper
                  (&local_368,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                   ,0x168,pcVar2);
        testing::internal::AssertHelper::operator=(&local_368,&local_360);
        testing::internal::AssertHelper::~AssertHelper(&local_368);
        std::__cxx11::string::~string
                  ((string *)
                   &builtA2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        testing::Message::~Message(&local_360);
      }
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_358);
      if (bVar1) {
        pvVar3 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__2.message_);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_4.message_,
                   pvVar3);
        pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar_4.message_,0);
        pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar.message_,0);
        testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                  ((EqHelper *)local_3b0,"builtA2[0]","builtA[0]",pvVar4,pvVar5);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3b0);
        if (!bVar1) {
          testing::Message::Message(&local_3b8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3b0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x16b,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_5.message_,&local_3b8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
          testing::Message::~Message(&local_3b8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3b0);
        pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar_4.message_,1);
        pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar.message_,1);
        testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                  ((EqHelper *)local_3d0,"builtA2[1]","builtA[1]",pvVar4,pvVar5);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3d0);
        if (!bVar1) {
          testing::Message::Message(&local_3d8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3d0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_6.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x16c,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_6.message_,&local_3d8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_6.message_);
          testing::Message::~Message(&local_3d8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3d0);
        pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar_4.message_,2);
        pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar.message_,0);
        testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                  ((EqHelper *)local_3f0,"builtA2[2]","builtA[0]",pvVar4,pvVar5);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_3f0);
        if (!bVar1) {
          testing::Message::Message(&local_3f8);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_3f0);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x16d,pcVar2);
          testing::internal::AssertHelper::operator=
                    ((AssertHelper *)&gtest_ar_7.message_,&local_3f8);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
          testing::Message::~Message(&local_3f8);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_3f0);
        pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar_4.message_,3);
        pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                           ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                            &gtest_ar.message_,1);
        testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                  ((EqHelper *)local_410,"builtA2[3]","builtA[1]",pvVar4,pvVar5);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_410);
        if (!bVar1) {
          testing::Message::Message(&local_418);
          pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_410);
          testing::internal::AssertHelper::AssertHelper
                    ((AssertHelper *)&builderB2,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x16e,pcVar2);
          testing::internal::AssertHelper::operator=((AssertHelper *)&builderB2,&local_418);
          testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&builderB2);
          testing::Message::~Message(&local_418);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_410);
        wasm::TypeBuilder::TypeBuilder(&local_428,1);
        local_448.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)0x0;
        local_448.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_finish = (pointer)0x0;
        local_448.fields.super__Vector_base<wasm::Field,_std::allocator<wasm::Field>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        wasm::Struct::Struct(&local_448);
        EVar6 = wasm::TypeBuilder::operator[](&local_428,0);
        resultB2.
        super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .
        super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
        .super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>.
        super__Variant_storage_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>._24_8_ =
             EVar6.builder;
        wasm::TypeBuilder::Entry::operator=
                  ((Entry *)((long)&resultB2.
                                    super_variant<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Variant_base<std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_assign_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Move_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                                    .
                                    super__Copy_ctor_alias<std::vector<wasm::HeapType>,_wasm::TypeBuilder::Error>
                            + 0x18),&local_448);
        wasm::Struct::~Struct(&local_448);
        wasm::TypeBuilder::build();
        testing::AssertionResult::AssertionResult<wasm::TypeBuilder::BuildResult>
                  ((AssertionResult *)local_488,(BuildResult *)&gtest_ar__3.message_,(type *)0x0);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_488);
        if (!bVar1) {
          testing::Message::Message(&local_490);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    ((string *)
                     &builtB2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage,(internal *)local_488,
                     (AssertionResult *)"resultB2","false","true",in_R9);
          pcVar2 = (char *)std::__cxx11::string::c_str();
          testing::internal::AssertHelper::AssertHelper
                    (&local_498,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                     ,0x173,pcVar2);
          testing::internal::AssertHelper::operator=(&local_498,&local_490);
          testing::internal::AssertHelper::~AssertHelper(&local_498);
          std::__cxx11::string::~string
                    ((string *)
                     &builtB2.super__Vector_base<wasm::HeapType,_std::allocator<wasm::HeapType>_>.
                      _M_impl.super__Vector_impl_data._M_end_of_storage);
          testing::Message::~Message(&local_490);
        }
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_488);
        if (bVar1) {
          pvVar3 = wasm::TypeBuilder::BuildResult::operator*((BuildResult *)&gtest_ar__3.message_);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_8.message_
                     ,pvVar3);
          pvVar4 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                              &gtest_ar_8.message_,0);
          pvVar5 = std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::operator[]
                             ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)
                              &gtest_ar_1.message_,0);
          testing::internal::EqHelper::Compare<wasm::HeapType,_wasm::HeapType,_nullptr>
                    ((EqHelper *)local_4e0,"builtB2[0]","builtB[0]",pvVar4,pvVar5);
          bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4e0);
          if (!bVar1) {
            testing::Message::Message(&local_4e8);
            pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_4e0);
            testing::internal::AssertHelper::AssertHelper
                      (&local_4f0,kNonFatalFailure,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/test/gtest/type-builder.cpp"
                       ,0x176,pcVar2);
            testing::internal::AssertHelper::operator=(&local_4f0,&local_4e8);
            testing::internal::AssertHelper::~AssertHelper(&local_4f0);
            testing::Message::~Message(&local_4e8);
          }
          testing::AssertionResult::~AssertionResult((AssertionResult *)local_4e0);
          std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                    ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_8.message_
                    );
        }
        wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__3.message_);
        wasm::TypeBuilder::~TypeBuilder(&local_428);
        std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                  ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_4.message_);
      }
      wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__2.message_);
      wasm::TypeBuilder::~TypeBuilder(&local_268);
      std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
                ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar_1.message_);
    }
    wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar__1.message_);
    wasm::TypeBuilder::~TypeBuilder(&local_130);
    std::vector<wasm::HeapType,_std::allocator<wasm::HeapType>_>::~vector
              ((vector<wasm::HeapType,_std::allocator<wasm::HeapType>_> *)&gtest_ar.message_);
  }
  wasm::TypeBuilder::BuildResult::~BuildResult((BuildResult *)&gtest_ar_.message_);
  wasm::TypeBuilder::~TypeBuilder(&local_18);
  return;
}

Assistant:

TEST_F(IsorecursiveTest, CanonicalizeGroups) {
  // Trivial types in the same group are not equivalent.
  TypeBuilder builderA(2);
  builderA.createRecGroup(0, 2);
  builderA[0] = Struct{};
  builderA[1] = Struct{};
  auto resultA = builderA.build();
  ASSERT_TRUE(resultA);
  auto builtA = *resultA;

  EXPECT_NE(builtA[0], builtA[1]);

  // But if they are in their own separate groups, they are equivalent.
  TypeBuilder builderB(2);
  builderB[0] = Struct{};
  builderB[1] = Struct{};
  auto resultB = builderB.build();
  ASSERT_TRUE(resultB);
  auto builtB = *resultB;

  EXPECT_EQ(builtB[0], builtB[1]);
  EXPECT_NE(builtB[0], builtA[0]);
  EXPECT_NE(builtB[0], builtA[1]);

  // If we build the same groups again, we should get the same results.
  TypeBuilder builderA2(4);
  builderA2.createRecGroup(0, 2);
  builderA2.createRecGroup(2, 2);
  builderA2[0] = Struct{};
  builderA2[1] = Struct{};
  builderA2[2] = Struct{};
  builderA2[3] = Struct{};
  auto resultA2 = builderA2.build();
  ASSERT_TRUE(resultA2);
  auto builtA2 = *resultA2;

  EXPECT_EQ(builtA2[0], builtA[0]);
  EXPECT_EQ(builtA2[1], builtA[1]);
  EXPECT_EQ(builtA2[2], builtA[0]);
  EXPECT_EQ(builtA2[3], builtA[1]);

  TypeBuilder builderB2(1);
  builderB2[0] = Struct{};
  auto resultB2 = builderB2.build();
  ASSERT_TRUE(resultB2);
  auto builtB2 = *resultB2;

  EXPECT_EQ(builtB2[0], builtB[0]);
}